

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O1

int ABC_AddTarget(ABC_Manager mng,int nog,char **names,int *values)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  void **ppvVar6;
  int *piVar7;
  char *pcVar8;
  char *__format;
  ulong uVar9;
  Abc_Obj_t *pObj;
  char *local_38;
  
  if (nog < 1) {
    puts("ABC_AddTarget: The target has no gates.");
    iVar5 = 0;
  }
  else {
    uVar9 = 0;
    mng->nog = 0;
    mng->vNodes->nSize = 0;
    mng->vValues->nSize = 0;
    do {
      iVar5 = stmm_lookup(mng->tName2Node,names[uVar9],&local_38);
      pcVar8 = local_38;
      if (iVar5 == 0) {
        pcVar8 = names[uVar9];
        __format = "ABC_AddTarget: The target gate \"%s\" is not in the network.\n";
        goto LAB_004f8de2;
      }
      pVVar3 = mng->vNodes;
      uVar1 = pVVar3->nCap;
      if (pVVar3->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar6;
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar1 * 2;
          if (iVar5 <= (int)uVar1) goto LAB_004f8ce6;
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
          }
          pVVar3->pArray = ppvVar6;
        }
        pVVar3->nCap = iVar5;
      }
LAB_004f8ce6:
      iVar5 = pVVar3->nSize;
      pVVar3->nSize = iVar5 + 1;
      pVVar3->pArray[iVar5] = pcVar8;
      uVar1 = values[uVar9];
      if (1 < uVar1) {
        pcVar8 = names[uVar9];
        __format = "ABC_AddTarget: The value of gate \"%s\" is not 0 or 1.\n";
LAB_004f8de2:
        printf(__format,pcVar8);
        return 0;
      }
      pVVar4 = mng->vValues;
      uVar2 = pVVar4->nCap;
      if (pVVar4->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar4->pArray == (int *)0x0) {
            piVar7 = (int *)malloc(0x40);
          }
          else {
            piVar7 = (int *)realloc(pVVar4->pArray,0x40);
          }
          pVVar4->pArray = piVar7;
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar2 * 2;
          if (iVar5 <= (int)uVar2) goto LAB_004f8d88;
          if (pVVar4->pArray == (int *)0x0) {
            piVar7 = (int *)malloc((ulong)uVar2 << 3);
          }
          else {
            piVar7 = (int *)realloc(pVVar4->pArray,(ulong)uVar2 << 3);
          }
          pVVar4->pArray = piVar7;
        }
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar4->nCap = iVar5;
      }
LAB_004f8d88:
      iVar5 = pVVar4->nSize;
      pVVar4->nSize = iVar5 + 1;
      pVVar4->pArray[iVar5] = uVar1;
      uVar9 = uVar9 + 1;
    } while ((uint)nog != uVar9);
    mng->nog = nog;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int ABC_AddTarget( ABC_Manager mng, int nog, char ** names, int * values )
{
    Abc_Obj_t * pObj;
    int i;
    if ( nog < 1 )
        { printf( "ABC_AddTarget: The target has no gates.\n" ); return 0; }
    // clear storage for the target
    mng->nog = 0;
    Vec_PtrClear( mng->vNodes );
    Vec_IntClear( mng->vValues );
    // save the target
    for ( i = 0; i < nog; i++ )
    {
        if ( !stmm_lookup( mng->tName2Node, names[i], (char **)&pObj ) )
            { printf( "ABC_AddTarget: The target gate \"%s\" is not in the network.\n", names[i] ); return 0; }
        Vec_PtrPush( mng->vNodes, pObj );
        if ( values[i] < 0 || values[i] > 1 )
            { printf( "ABC_AddTarget: The value of gate \"%s\" is not 0 or 1.\n", names[i] ); return 0; }
        Vec_IntPush( mng->vValues, values[i] );
    }
    mng->nog = nog;
    return 1;
}